

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GaussianPlumeRecord
          (GaussianPlumeRecord *this,KDataStream *stream)

{
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GaussianPlumeRecord_00223fb8;
  WorldCoordinates::WorldCoordinates(&this->m_SrcLocation);
  EulerAngles::EulerAngles(&this->m_Ori);
  Vector::Vector(&this->m_PlumeLWH);
  Vector::Vector(&this->m_DDTLEH);
  Vector::Vector(&this->m_LdEdgeVel);
  (*(this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase[3])(this,stream);
  return;
}

Assistant:

GaussianPlumeRecord::GaussianPlumeRecord(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}